

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
* __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::emplace_decomposable_with_hash<std::__cxx11::string,std::__cxx11::string_const&>
          (pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  slot_type *psVar2;
  size_t sVar3;
  size_t i;
  ctrl_t *pcVar4;
  ctrl_t *pcVar5;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_00;
  bool bVar6;
  
  this_00 = (raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)(this + (((uint)(hashval >> 0x18) & 0xff ^
                        (uint)hashval >> 0x10 ^ (uint)(hashval >> 8) & 0xffffff) & 0xf) * 0x30);
  i = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::_find_key<std::__cxx11::string>
                ((raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_00,key,hashval);
  bVar6 = i == 0xffffffffffffffff;
  if (bVar6) {
    i = raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::prepare_insert(this_00,hashval);
    psVar2 = this_00->slots_;
    pcVar1 = (args->_M_dataplus)._M_p;
    psVar2[i]._M_len = args->_M_string_length;
    psVar2[i]._M_str = pcVar1;
    raw_hash_set<phmap::priv::FlatHashSetPolicy<std::basic_string_view<char,_std::char_traits<char>_>_>,_phmap::priv::StringHashEqT<char>::Hash,_phmap::priv::StringHashEqT<char>::Eq,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::set_ctrl(this_00,i,(byte)hashval & 0x7f);
    pcVar4 = this_00->ctrl_;
    pcVar5 = pcVar4 + i;
  }
  else {
    pcVar4 = this_00->ctrl_;
    pcVar5 = pcVar4 + i;
  }
  psVar2 = this_00->slots_;
  sVar3 = this_00->capacity_;
  (__return_storage_ptr__->first).inner_ = (Inner *)this_00;
  (__return_storage_ptr__->first).inner_end_ = (Inner *)(this + 0x300);
  (__return_storage_ptr__->first).it_.ctrl_ = pcVar5;
  (__return_storage_ptr__->first).it_.field_1.slot_ = psVar2 + i;
  (__return_storage_ptr__->first).it_end_.ctrl_ = pcVar4 + sVar3;
  __return_storage_ptr__->second = bVar6;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> emplace_decomposable_with_hash(const K& key, size_t hashval, Args&&... args)
    {
        Inner& inner   = sets_[subidx(hashval)];
        auto&  set     = inner.set_;
        UniqueLock m(inner);
        
        size_t offset = set._find_key(key, hashval);
        if (offset == (size_t)-1) {
            offset = set.prepare_insert(hashval);
            set.emplace_at(offset, std::forward<Args>(args)...);
            set.set_ctrl(offset, H2(hashval));
            return make_rv(&inner, {set.iterator_at(offset), true});
        }
        return make_rv(&inner, {set.iterator_at(offset), false});
    }